

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool anon_unknown.dwarf_b692::checkAttributeUniquenessUnsortedBrute(ObjectIterator *it)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Slice SVar2;
  ObjectIterator *pOVar3;
  reference pvVar4;
  char *__s;
  ObjectIterator *in_RDI;
  string_view sVar5;
  ValueLength i;
  ValueLength index;
  string_view key;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> keys;
  ObjectIterator *in_stack_ffffffffffffff68;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *in_stack_ffffffffffffff70;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *in_stack_ffffffffffffff80;
  ObjectIterator *in_stack_ffffffffffffff88;
  ObjectIterator *this;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *local_58;
  
  std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::array
            (in_stack_ffffffffffffff80);
  do {
    __s = (char *)0x1;
    SVar2 = arangodb::velocypack::ObjectIterator::key
                      (in_stack_ffffffffffffff88,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
    sVar5 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       in_stack_ffffffffffffff88);
    this = (ObjectIterator *)sVar5._M_len;
    local_58 = (array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *)sVar5._M_str;
    pOVar3 = (ObjectIterator *)
             arangodb::velocypack::ObjectIterator::index(in_RDI,__s,(int)sVar5._M_str);
    for (in_stack_ffffffffffffff88 = (ObjectIterator *)0x0; in_stack_ffffffffffffff88 < pOVar3;
        in_stack_ffffffffffffff88 =
             (ObjectIterator *)((long)&(in_stack_ffffffffffffff88->_slice)._start + 1)) {
      pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff68 = this;
      in_stack_ffffffffffffff80 =
           (array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *)pvVar4->_M_str;
      __x._M_str = (char *)in_stack_ffffffffffffff68;
      __x._M_len = (size_t)SVar2._start;
      __y._M_str = (char *)pOVar3;
      __y._M_len = (size_t)in_stack_ffffffffffffff88;
      in_stack_ffffffffffffff70 = local_58;
      this = in_stack_ffffffffffffff68;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        return false;
      }
    }
    pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::operator[]
                       (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    pvVar4->_M_len = (size_t)this;
    pvVar4->_M_str = (char *)local_58;
    arangodb::velocypack::ObjectIterator::next(this);
    bVar1 = arangodb::velocypack::ObjectIterator::valid(in_RDI);
  } while (bVar1);
  return true;
}

Assistant:

bool checkAttributeUniquenessUnsortedBrute(ObjectIterator& it) {
  std::array<std::string_view, linearAttributeUniquenessCutoff> keys;

  do {
    // key(true) guarantees a String as returned type
    std::string_view key = it.key(true).stringView();

    ValueLength index = it.index();
    // compare with all other already looked-at keys
    for (ValueLength i = 0; i < index; ++i) {
      if (VELOCYPACK_UNLIKELY(keys[i] == key)) {
        return false;
      }
    }
    keys[index] = key;
    it.next();

  } while (it.valid());

  return true;
}